

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O0

bool __thiscall
udpdiscovery::Packet::Serialize(Packet *this,ProtocolVersion protocol_version,string *buffer_out)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_38 [8];
  BufferView buffer_view;
  string *buffer_out_local;
  ProtocolVersion protocol_version_local;
  Packet *this_local;
  
  buffer_view._8_8_ = buffer_out;
  if (protocol_version == kProtocolVersion0) {
    uVar2 = std::__cxx11::string::size();
    if (0x8000 < uVar2) {
      return false;
    }
  }
  else if ((protocol_version == kProtocolVersion1) &&
          (uVar2 = std::__cxx11::string::size(), 0x1000 < uVar2)) {
    return false;
  }
  impl::BufferView::BufferView((BufferView *)local_38,(string *)buffer_view._8_8_);
  bVar1 = Serialize(this,protocol_version,kSerialize,(BufferView *)local_38);
  return bVar1;
}

Assistant:

bool Packet::Serialize(ProtocolVersion protocol_version,
                       std::string& buffer_out) {
  if (protocol_version == kProtocolVersion0) {
    if (user_data_.size() > kMaxUserDataSizeV0) {
      return false;
    }
  } else if (protocol_version == kProtocolVersion1) {
    if (user_data_.size() > kMaxUserDataSizeV1) {
      return false;
    }
  }

  impl::BufferView buffer_view(&buffer_out);
  return Serialize(protocol_version, impl::kSerialize, &buffer_view);
}